

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O0

int uv__signal_compare(uv_signal_t *w1,uv_signal_t *w2)

{
  uv_signal_t *w2_local;
  uv_signal_t *w1_local;
  int local_4;
  
  if (w1->signum < w2->signum) {
    local_4 = -1;
  }
  else if (w2->signum < w1->signum) {
    local_4 = 1;
  }
  else if (w1->loop < w2->loop) {
    local_4 = -1;
  }
  else if (w2->loop < w1->loop) {
    local_4 = 1;
  }
  else if (w1 < w2) {
    local_4 = -1;
  }
  else if (w2 < w1) {
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int uv__signal_compare(uv_signal_t* w1, uv_signal_t* w2) {
  /* Compare signums first so all watchers with the same signnum end up
   * adjacent.
   */
  if (w1->signum < w2->signum) return -1;
  if (w1->signum > w2->signum) return 1;

  /* Sort by loop pointer, so we can easily look up the first item after
   * { .signum = x, .loop = NULL }.
   */
  if (w1->loop < w2->loop) return -1;
  if (w1->loop > w2->loop) return 1;

  if (w1 < w2) return -1;
  if (w1 > w2) return 1;

  return 0;
}